

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

void uv__platform_invalidate_fd(uv_loop_t *loop,int fd)

{
  uv__io_t *puVar1;
  uintptr_t nfds;
  uintptr_t i;
  epoll_event dummy;
  epoll_event *events;
  int fd_local;
  uv_loop_t *loop_local;
  
  if (loop->watchers == (uv__io_t **)0x0) {
    __assert_fail("loop->watchers != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/linux-core.c"
                  ,0x99,"void uv__platform_invalidate_fd(uv_loop_t *, int)");
  }
  if (fd < 0) {
    __assert_fail("fd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/linux-core.c"
                  ,0x9a,"void uv__platform_invalidate_fd(uv_loop_t *, int)");
  }
  dummy.data = (epoll_data_t)((epoll_data_t *)(loop->watchers + loop->nwatchers))->ptr;
  puVar1 = loop->watchers[loop->nwatchers + 1];
  if ((uv__io_t *)dummy.data.ptr != (uv__io_t *)0x0) {
    for (nfds = 0; nfds < puVar1; nfds = nfds + 1) {
      if (*(int *)((long)dummy.data.ptr + nfds * 0xc + 4) == fd) {
        *(undefined4 *)((long)dummy.data.ptr + nfds * 0xc + 4) = 0xffffffff;
      }
    }
  }
  if (-1 < loop->backend_fd) {
    memset((void *)((long)&i + 4),0,0xc);
    epoll_ctl(loop->backend_fd,2,fd,(epoll_event *)((long)&i + 4));
  }
  return;
}

Assistant:

void uv__platform_invalidate_fd(uv_loop_t* loop, int fd) {
  struct epoll_event* events;
  struct epoll_event dummy;
  uintptr_t i;
  uintptr_t nfds;

  assert(loop->watchers != NULL);
  assert(fd >= 0);

  events = (struct epoll_event*) loop->watchers[loop->nwatchers];
  nfds = (uintptr_t) loop->watchers[loop->nwatchers + 1];
  if (events != NULL)
    /* Invalidate events with same file descriptor */
    for (i = 0; i < nfds; i++)
      if (events[i].data.fd == fd)
        events[i].data.fd = -1;

  /* Remove the file descriptor from the epoll.
   * This avoids a problem where the same file description remains open
   * in another process, causing repeated junk epoll events.
   *
   * We pass in a dummy epoll_event, to work around a bug in old kernels.
   */
  if (loop->backend_fd >= 0) {
    /* Work around a bug in kernels 3.10 to 3.19 where passing a struct that
     * has the EPOLLWAKEUP flag set generates spurious audit syslog warnings.
     */
    memset(&dummy, 0, sizeof(dummy));
    epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, &dummy);
  }
}